

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

uniformDMatFunctionPointer __thiscall
gl4cts::GPUShaderFP64Test10::getUniformFunctionForDMat
          (GPUShaderFP64Test10 *this,GLuint argument,functionObject *function_object)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TestError *this_00;
  undefined4 in_register_00000034;
  
  iVar1 = (*function_object->_vptr_functionObject[4])
                    (function_object,CONCAT44(in_register_00000034,argument));
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (iVar1 - 5U < 9) {
    return *(uniformDMatFunctionPointer *)
            (CONCAT44(extraout_var,iVar2) + 0x15d8 + (ulong)(iVar1 - 5U) * 0x10);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Not implemented",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
             ,0x3844);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GPUShaderFP64Test10::uniformDMatFunctionPointer GPUShaderFP64Test10::getUniformFunctionForDMat(
	glw::GLuint argument, const functionObject& function_object) const
{
	const Utils::_variable_type argument_type = function_object.getArgumentType(argument);
	const glw::Functions&		gl			  = m_context.getRenderContext().getFunctions();

	switch (argument_type)
	{
	case Utils::VARIABLE_TYPE_DMAT2:
		return gl.uniformMatrix2dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT2X3:
		return gl.uniformMatrix2x3dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT2X4:
		return gl.uniformMatrix2x4dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT3:
		return gl.uniformMatrix3dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT3X2:
		return gl.uniformMatrix3x2dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT3X4:
		return gl.uniformMatrix3x4dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT4:
		return gl.uniformMatrix4dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT4X2:
		return gl.uniformMatrix4x2dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT4X3:
		return gl.uniformMatrix4x3dv;
		break;
	default:
		break;
	}

	TCU_FAIL("Not implemented");
	return 0;
}